

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.cpp
# Opt level: O2

Result __thiscall Kernel::QKbo::compare(QKbo *this,Literal *l1,Literal *l2)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  size_t sVar5;
  Option<Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>_&> *pOVar6;
  MultiSet<Kernel::SignedTerm> *pMVar7;
  MultiSet<Kernel::SignedTerm> *pMVar8;
  bool bVar9;
  bool bVar10;
  type tVar11;
  Result RVar12;
  ulong uVar13;
  IntegerConstantType *o;
  TermList TVar14;
  TermList TVar15;
  tuple<unsigned_int,_Kernel::IntegerConstantType> *ptVar16;
  _Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType> *p_Var17;
  int iVar18;
  Result RVar19;
  tuple<unsigned_int,_Kernel::IntegerConstantType> *__a;
  uint uVar20;
  _Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType> *p_Var21;
  uint uVar22;
  ulong uVar23;
  Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_> l;
  anon_class_32_4_db1a4f16 cmp;
  _Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType> local_168;
  IntegerConstantType min;
  _Head_base<0UL,_unsigned_int,_false> local_140;
  Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_> r;
  DArray<Lib::Option<Kernel::Ordering::Result>_> local_108;
  MultiSet<Kernel::SignedTerm> *local_f0;
  MultiSet<Kernel::SignedTerm> *local_e8;
  OptionBaseRef<Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>_*> local_e0;
  IntegerConstantType local_d8;
  IntegerConstantType local_c8;
  undefined1 local_b8 [24];
  Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  a2_;
  Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  a1_;
  anon_class_24_3_676cea06 local_60;
  tuple<unsigned_int,_Kernel::IntegerConstantType> local_48;
  
  if (l1 == l2) {
    return EQUAL;
  }
  bVar9 = AlascaState::interpretedPred(l1);
  bVar10 = AlascaState::interpretedPred(l2);
  if (bVar9 && !bVar10) {
    return LESS;
  }
  if (bVar10 && !bVar9) {
    return GREATER;
  }
  if (!bVar9 && !bVar10) {
    RVar12 = PrecedenceOrdering::comparePredicatePrecedences
                       (&(this->_kbo).super_PrecedenceOrdering,(l1->super_Term)._functor,
                        (l2->super_Term)._functor);
    if (RVar12 != EQUAL) {
      return RVar12;
    }
    uVar20 = Term::numTermArguments(&l1->super_Term);
    uVar22 = Term::numTermArguments(&l2->super_Term);
    cmp.ls = (MultiSet<Kernel::SignedTerm> *)0x0;
    cmp.rs = (MultiSet<Kernel::SignedTerm> *)CONCAT44(cmp.rs._4_4_,uVar22);
    l._stack = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x0;
    l._cursor = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)CONCAT44(l._cursor._4_4_,uVar20)
    ;
    l._capacity = (size_t)l1;
    cmp.memo = (Option<Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>_&> *)l2;
    while( true ) {
      if ((uint)l._cursor <= (uint)l._stack) break;
      TVar14 = Lib::
               MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/TermIterators.hpp:848:12),_Kernel::TermList>
               ::next((MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>
                       *)&l);
      TVar15 = Lib::
               MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/TermIterators.hpp:848:12),_Kernel::TermList>
               ::next((MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>
                       *)&cmp);
      RVar12 = compare(this,TVar14,TVar15);
      if (RVar12 != EQUAL) {
        return RVar12;
      }
    }
    uVar3 = (l2->super_Term)._args[0]._content;
    uVar4 = (l1->super_Term)._args[0]._content;
    RVar12 = EQUAL;
    if ((uVar4 & 4) == 0) {
      RVar12 = (uint)((uVar3 & 4) == 0) * 2 + GREATER;
    }
    RVar19 = LESS;
    if ((uVar3 & 4) != 0) {
      RVar19 = RVar12;
    }
    if ((uVar4 & 4) != 0) {
      return RVar19;
    }
    return RVar12;
  }
  atomsWithLvl(&a1_,this,l1);
  atomsWithLvl(&a2_,this,l2);
  RVar12 = INCOMPARABLE;
  if ((a1_.
       super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
       ._isSome != true) ||
     (a2_.
      super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
      ._isSome == false)) goto LAB_0047586c;
  local_108._size = 0;
  local_108._capacity = 0;
  local_108._array = (Option<Kernel::Ordering::Result> *)0x0;
  IntegerConstantType::IntegerConstantType
            (&local_c8,
             (IntegerConstantType *)
             a2_.
             super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
             ._elem._elem.init.
             super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
             .
             super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
             ._M_head_impl._self._M_t.
             super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
             .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>.
             _M_head_impl);
  IntegerConstantType::IntegerConstantType
            (&local_d8,
             (IntegerConstantType *)
             a1_.
             super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
             ._elem._elem.init.
             super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
             .
             super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
             ._M_head_impl._self._M_t.
             super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
             .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>.
             _M_head_impl);
  local_60.a1 = (tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                 *)&a1_.
                    super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                    ._elem;
  local_60.a2 = (tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                 *)&a2_.
                    super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                    ._elem;
  local_e0._elem = &local_108;
  local_60.this = this;
  if ((Option<Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>_&> *)local_108._size ==
      (Option<Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>_&> *)0x0) {
    l._capacity = 0;
    Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>::initialized
              ((DArray<Lib::Option<Kernel::Ordering::Result>_> *)&cmp,
               (ulong)(uint)((int)((ulong)(*(long *)((long)a2_.
                                                  super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                                                  ._elem._elem.init.
                                                  super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                                                  .
                                                  super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                                                  ._M_head_impl._self._M_t.
                                                  super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                                                  .
                                                  super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                                                  ._M_head_impl + 0x20) -
                                          *(long *)((long)a2_.
                                                  super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                                                  ._elem._elem.init.
                                                  super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                                                  .
                                                  super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                                                  ._M_head_impl._self._M_t.
                                                  super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                                                  .
                                                  super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                                                  ._M_head_impl + 0x18)) >> 5) *
                            (int)((ulong)(*(long *)((long)a1_.
                                                  super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                                                  ._elem._elem.init.
                                                  super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                                                  .
                                                  super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                                                  ._M_head_impl._self._M_t.
                                                  super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                                                  .
                                                  super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                                                  ._M_head_impl + 0x20) -
                                         *(long *)((long)a1_.
                                                  super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                                                  ._elem._elem.init.
                                                  super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                                                  .
                                                  super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                                                  ._M_head_impl._self._M_t.
                                                  super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                                                  .
                                                  super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                                                  ._M_head_impl + 0x18)) >> 5)),
               (Option<Kernel::Ordering::Result> *)&l);
    pMVar8 = cmp.rs;
    pMVar7 = cmp.ls;
    pOVar6 = cmp.memo;
    cmp.memo = (Option<Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>_&> *)local_108._size;
    cmp.ls = (MultiSet<Kernel::SignedTerm> *)local_108._capacity;
    local_108._size = (size_t)pOVar6;
    local_108._capacity = (size_t)pMVar7;
    cmp.rs = (MultiSet<Kernel::SignedTerm> *)local_108._array;
    local_108._array = (Option<Kernel::Ordering::Result> *)pMVar8;
    Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>::~DArray
              ((DArray<Lib::Option<Kernel::Ordering::Result>_> *)&cmp);
  }
  cmp.ls = (MultiSet<Kernel::SignedTerm> *)
           ((long)a1_.
                  super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                  ._elem._elem.init.
                  super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                  .
                  super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                  ._M_head_impl._self._M_t.
                  super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                  .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>.
                  _M_head_impl + 0x10);
  cmp.rs = (MultiSet<Kernel::SignedTerm> *)
           ((long)a2_.
                  super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                  ._elem._elem.init.
                  super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                  .
                  super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                  ._M_head_impl._self._M_t.
                  super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                  .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>.
                  _M_head_impl + 0x10);
  cmp.memo = (Option<Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>_&> *)&local_e0;
  cmp.cmp_ = &local_60;
  lVar1 = *(long *)((long)a1_.
                          super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                          ._elem._elem.init.
                          super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                          .
                          super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                          ._M_head_impl._self._M_t.
                          super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          .
                          super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                          ._M_head_impl + 0x20);
  lVar2 = *(long *)((long)a1_.
                          super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                          ._elem._elem.init.
                          super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                          .
                          super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                          ._M_head_impl._self._M_t.
                          super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          .
                          super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                          ._M_head_impl + 0x18);
  l._cursor = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x0;
  l._end = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x0;
  l._capacity = 0;
  l._stack = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x0;
  local_f0 = cmp.rs;
  local_e8 = cmp.ls;
  for (iVar18 = 0; (int)((ulong)(lVar1 - lVar2) >> 5) != iVar18; iVar18 = iVar18 + 1) {
    MultiSet<Kernel::SignedTerm>::cntAt((MultiSet<Kernel::SignedTerm> *)local_b8,(uint)local_e8);
    IntegerConstantType::operator*
              ((IntegerConstantType *)&local_168,(IntegerConstantType *)local_b8);
    IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)&r,(IntegerConstantType *)&local_168);
    r._cursor = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)CONCAT44(r._cursor._4_4_,iVar18)
    ;
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_168);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)local_b8);
    std::_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>::_Tuple_impl
              ((_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType> *)&min,
               (_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType> *)&r);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&r);
    Lib::Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_>::push
              (&l,(tuple<unsigned_int,_Kernel::IntegerConstantType> *)&min);
    IntegerConstantType::~IntegerConstantType(&min);
  }
  lVar1 = *(long *)((long)a2_.
                          super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                          ._elem._elem.init.
                          super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                          .
                          super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                          ._M_head_impl._self._M_t.
                          super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          .
                          super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                          ._M_head_impl + 0x20);
  lVar2 = *(long *)((long)a2_.
                          super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                          ._elem._elem.init.
                          super__Tuple_impl<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
                          .
                          super__Head_base<0UL,_Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_false>
                          ._M_head_impl._self._M_t.
                          super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          .
                          super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                          ._M_head_impl + 0x18);
  r._cursor = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x0;
  r._end = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x0;
  r._capacity = 0;
  r._stack = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x0;
  uVar20 = 0;
  while (uVar22 = uVar20, (uint)((ulong)(lVar1 - lVar2) >> 5) != uVar22) {
    MultiSet<Kernel::SignedTerm>::cntAt((MultiSet<Kernel::SignedTerm> *)&local_48,(uint)local_f0);
    IntegerConstantType::operator*((IntegerConstantType *)local_b8,(IntegerConstantType *)&local_48)
    ;
    IntegerConstantType::IntegerConstantType(&min,(IntegerConstantType *)local_b8);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)local_b8);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_48);
    std::_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>::_Tuple_impl
              (&local_168,(_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType> *)&min);
    IntegerConstantType::~IntegerConstantType(&min);
    Lib::Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_>::push
              (&r,(tuple<unsigned_int,_Kernel::IntegerConstantType> *)&local_168);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_168);
    local_140._M_head_impl = uVar22;
    uVar20 = uVar22 + 1;
  }
  for (uVar20 = 0; (ulong)uVar20 < (ulong)(((long)l._cursor - (long)l._stack) / 0x18);
      uVar20 = (uVar20 + 1) - (uint)(uVar23 < uVar13)) {
    __a = l._stack + uVar20;
    uVar22 = 0;
    while( true ) {
      ptVar16 = r._stack;
      uVar23 = (ulong)uVar22;
      uVar13 = ((long)r._cursor - (long)r._stack) / 0x18;
      if (uVar13 <= uVar23) break;
      tVar11 = OrderingUtils::
               _mulExt<Kernel::SignedTerm,_Kernel::SignedTerm,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/QKbo.cpp:76:27)>
               ::anon_class_32_4_db1a4f16::operator()
                         (&cmp,(__a->
                               super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                               super__Head_base<0UL,_unsigned_int,_false>._M_head_impl,
                          r._stack[uVar23].
                          super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>.
                          super__Head_base<0UL,_unsigned_int,_false>._M_head_impl);
      if (tVar11 == EQUAL) {
        ptVar16 = ptVar16 + uVar23;
        o = std::min<Kernel::IntegerConstantType>
                      ((IntegerConstantType *)__a,(IntegerConstantType *)ptVar16);
        IntegerConstantType::IntegerConstantType(&min,o);
        IntegerConstantType::operator-=((IntegerConstantType *)__a,&min);
        IntegerConstantType::operator-=((IntegerConstantType *)ptVar16,&min);
        IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_168,0);
        bVar9 = Kernel::operator==((IntegerConstantType *)__a,(IntegerConstantType *)&local_168);
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_168);
        if (bVar9) {
          Lib::Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_>::swapRemove
                    ((tuple<unsigned_int,_Kernel::IntegerConstantType> *)local_b8,&l,uVar20);
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)local_b8);
        }
        IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_168,0);
        bVar9 = Kernel::operator==((IntegerConstantType *)ptVar16,(IntegerConstantType *)&local_168)
        ;
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_168);
        if (bVar9) {
          Lib::Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_>::swapRemove
                    (&local_48,&r,uVar22);
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_48);
        }
        IntegerConstantType::~IntegerConstantType(&min);
        break;
      }
      uVar22 = uVar22 + 1;
    }
  }
  if (l._cursor == l._stack) {
    RVar12 = r._cursor == r._stack | LESS;
  }
  else if (r._cursor == r._stack) {
    RVar12 = GREATER;
  }
  else {
    p_Var17 = &(l._cursor)->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>;
    while (p_Var17 != &(l._stack)->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>
          ) {
      p_Var17 = p_Var17 + -1;
      std::_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>::_Tuple_impl
                (&local_168,p_Var17);
      p_Var21 = &(r._cursor)->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>;
      do {
        if (p_Var21 ==
            &(r._stack)->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>) {
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_168);
          RVar12 = GREATER;
          p_Var17 = &(r._cursor)->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>;
          goto LAB_0047544e;
        }
        p_Var21 = p_Var21 + -1;
        std::_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>::_Tuple_impl
                  ((_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType> *)&min,p_Var21);
        tVar11 = OrderingUtils::
                 _mulExt<Kernel::SignedTerm,_Kernel::SignedTerm,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/QKbo.cpp:76:27)>
                 ::anon_class_32_4_db1a4f16::operator()
                           (&cmp,local_168.super__Head_base<0UL,_unsigned_int,_false>._M_head_impl,
                            local_140._M_head_impl);
        IntegerConstantType::~IntegerConstantType(&min);
      } while (tVar11 != LESS);
      IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_168);
    }
    RVar12 = LESS;
  }
LAB_004754c4:
  Lib::Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_>::~Stack(&r);
  Lib::Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_>::~Stack(&l);
  IntegerConstantType::~IntegerConstantType(&local_d8);
  IntegerConstantType::~IntegerConstantType(&local_c8);
  Lib::DArray<Lib::Option<Kernel::Ordering::Result>_>::~DArray(&local_108);
  if (RVar12 != EQUAL) goto LAB_0047586c;
  TVar14 = SortHelper::getTermArgSort(&l1->super_Term,0);
  TVar15 = AtomicSort::intSort();
  if (TVar15._content == TVar14._content) {
    uVar20 = (l1->super_Term)._functor;
    uVar22 = (l2->super_Term)._functor;
    if (uVar20 == 0) {
      if (uVar22 != 0) {
LAB_00475869:
        RVar12 = LESS;
        goto LAB_0047586c;
      }
      nfEquality<Kernel::NumTraits<Kernel::IntegerConstantType>>
                ((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&cmp,this,l1);
      nfEquality<Kernel::NumTraits<Kernel::IntegerConstantType>>
                ((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&l,this,l2);
      RVar12 = OrderingUtils::
               mulExt<Kernel::TermList,Kernel::TermList,Kernel::QKbo::asClosure()const::_lambda(auto:1_const&,auto:2_const&)_1_>
                         ((MultiSet<Kernel::TermList> *)cmp.memo,
                          (MultiSet<Kernel::TermList> *)l._capacity,(anon_class_8_1_8991fb9c)this);
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&l);
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&cmp);
      if (RVar12 != EQUAL) goto LAB_0047586c;
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&cmp);
      pOVar6 = cmp.memo;
      TVar14 = Term::termArg(&l1->super_Term,0);
      Term::termArg(&l1->super_Term,1);
      MultiSet<Kernel::TermList>::init
                ((MultiSet<Kernel::TermList> *)pOVar6,(EVP_PKEY_CTX *)TVar14._content);
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&l);
      sVar5 = l._capacity;
      TVar14 = Term::termArg(&l2->super_Term,0);
      Term::termArg(&l2->super_Term,1);
      MultiSet<Kernel::TermList>::init
                ((MultiSet<Kernel::TermList> *)sVar5,(EVP_PKEY_CTX *)TVar14._content);
      RVar12 = OrderingUtils::
               mulExt<Kernel::TermList,Kernel::TermList,Kernel::QKbo::asClosure()const::_lambda(auto:1_const&,auto:2_const&)_1_>
                         ((MultiSet<Kernel::TermList> *)cmp.memo,
                          (MultiSet<Kernel::TermList> *)l._capacity,(anon_class_8_1_8991fb9c)this);
LAB_00475969:
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&l);
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&cmp);
      goto LAB_0047586c;
    }
    if (uVar22 == 0) {
LAB_0047568b:
      RVar12 = GREATER;
      goto LAB_0047586c;
    }
    uVar22 = NumTraits<Kernel::IntegerConstantType>::isIntF();
    TVar14 = Term::termArg(&l1->super_Term,0);
    TVar15 = Term::termArg(&l2->super_Term,0);
    RVar12 = compare(this,TVar14,TVar15);
LAB_004755d8:
    if (uVar20 == uVar22 || RVar12 != EQUAL) goto LAB_0047586c;
  }
  else {
    TVar15 = AtomicSort::rationalSort();
    if (TVar15._content == TVar14._content) {
      uVar20 = (l1->super_Term)._functor;
      uVar22 = (l2->super_Term)._functor;
      if (uVar20 == 0) {
        if (uVar22 != 0) goto LAB_00475869;
        nfEquality<Kernel::NumTraits<Kernel::RationalConstantType>>
                  ((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)&cmp,this,l1);
        nfEquality<Kernel::NumTraits<Kernel::RationalConstantType>>
                  ((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)&l,this,l2);
        RVar12 = OrderingUtils::
                 mulExt<Kernel::TermList,Kernel::TermList,Kernel::QKbo::asClosure()const::_lambda(auto:1_const&,auto:2_const&)_1_>
                           ((MultiSet<Kernel::TermList> *)cmp.memo,
                            (MultiSet<Kernel::TermList> *)l._capacity,(anon_class_8_1_8991fb9c)this)
        ;
        Lib::
        Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&l);
        Lib::
        Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&cmp);
        if (RVar12 != EQUAL) goto LAB_0047586c;
        Lib::
        Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&cmp);
        pOVar6 = cmp.memo;
        TVar14 = Term::termArg(&l1->super_Term,0);
        Term::termArg(&l1->super_Term,1);
        MultiSet<Kernel::TermList>::init
                  ((MultiSet<Kernel::TermList> *)pOVar6,(EVP_PKEY_CTX *)TVar14._content);
        Lib::
        Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&l);
        sVar5 = l._capacity;
        TVar14 = Term::termArg(&l2->super_Term,0);
        Term::termArg(&l2->super_Term,1);
        MultiSet<Kernel::TermList>::init
                  ((MultiSet<Kernel::TermList> *)sVar5,(EVP_PKEY_CTX *)TVar14._content);
        RVar12 = OrderingUtils::
                 mulExt<Kernel::TermList,Kernel::TermList,Kernel::QKbo::asClosure()const::_lambda(auto:1_const&,auto:2_const&)_1_>
                           ((MultiSet<Kernel::TermList> *)cmp.memo,
                            (MultiSet<Kernel::TermList> *)l._capacity,(anon_class_8_1_8991fb9c)this)
        ;
        goto LAB_00475969;
      }
      if (uVar22 == 0) goto LAB_0047568b;
      uVar22 = NumTraits<Kernel::RationalConstantType>::isIntF();
      TVar14 = Term::termArg(&l1->super_Term,0);
      TVar15 = Term::termArg(&l2->super_Term,0);
      RVar12 = compare(this,TVar14,TVar15);
      goto LAB_004755d8;
    }
    TVar15 = AtomicSort::realSort();
    if (TVar15._content != TVar14._content) {
      RVar12 = EQUAL;
      goto LAB_0047586c;
    }
    uVar20 = (l1->super_Term)._functor;
    uVar22 = (l2->super_Term)._functor;
    if (uVar20 == 0) {
      if (uVar22 != 0) goto LAB_00475869;
      nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>
                ((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&cmp,this,l1);
      nfEquality<Kernel::NumTraits<Kernel::RealConstantType>>
                ((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&l,this,l2);
      RVar12 = OrderingUtils::
               mulExt<Kernel::TermList,Kernel::TermList,Kernel::QKbo::asClosure()const::_lambda(auto:1_const&,auto:2_const&)_1_>
                         ((MultiSet<Kernel::TermList> *)cmp.memo,
                          (MultiSet<Kernel::TermList> *)l._capacity,(anon_class_8_1_8991fb9c)this);
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&l);
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&cmp);
      if (RVar12 != EQUAL) goto LAB_0047586c;
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&cmp);
      pOVar6 = cmp.memo;
      TVar14 = Term::termArg(&l1->super_Term,0);
      Term::termArg(&l1->super_Term,1);
      MultiSet<Kernel::TermList>::init
                ((MultiSet<Kernel::TermList> *)pOVar6,(EVP_PKEY_CTX *)TVar14._content);
      Lib::Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Kernel::MultiSet<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&l);
      sVar5 = l._capacity;
      TVar14 = Term::termArg(&l2->super_Term,0);
      Term::termArg(&l2->super_Term,1);
      MultiSet<Kernel::TermList>::init
                ((MultiSet<Kernel::TermList> *)sVar5,(EVP_PKEY_CTX *)TVar14._content);
      RVar12 = OrderingUtils::
               mulExt<Kernel::TermList,Kernel::TermList,Kernel::QKbo::asClosure()const::_lambda(auto:1_const&,auto:2_const&)_1_>
                         ((MultiSet<Kernel::TermList> *)cmp.memo,
                          (MultiSet<Kernel::TermList> *)l._capacity,(anon_class_8_1_8991fb9c)this);
      goto LAB_00475969;
    }
    if (uVar22 == 0) goto LAB_0047568b;
    uVar22 = NumTraits<Kernel::RealConstantType>::isIntF();
    TVar14 = Term::termArg(&l1->super_Term,0);
    TVar15 = Term::termArg(&l2->super_Term,0);
    RVar12 = compare(this,TVar14,TVar15);
    if (RVar12 != EQUAL || uVar20 == uVar22) goto LAB_0047586c;
  }
  RVar12 = PrecedenceOrdering::comparePredicatePrecedences
                     (&(this->_kbo).super_PrecedenceOrdering,(l1->super_Term)._functor,
                      (l2->super_Term)._functor);
LAB_0047586c:
  Lib::
  OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  ::~OptionBase(&a2_.
                 super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
               );
  Lib::
  OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  ::~OptionBase(&a1_.
                 super_OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
               );
  return RVar12;
LAB_0047544e:
  if (p_Var17 == &(r._stack)->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>)
  goto LAB_004754c4;
  p_Var17 = p_Var17 + -1;
  std::_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>::_Tuple_impl(&local_168,p_Var17);
  p_Var21 = &(l._cursor)->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>;
  do {
    if (p_Var21 == &(l._stack)->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>) {
      IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_168);
      RVar12 = INCOMPARABLE;
      goto LAB_004754c4;
    }
    p_Var21 = p_Var21 + -1;
    std::_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>::_Tuple_impl
              ((_Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType> *)&min,p_Var21);
    tVar11 = OrderingUtils::
             _mulExt<Kernel::SignedTerm,_Kernel::SignedTerm,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/QKbo.cpp:76:27)>
             ::anon_class_32_4_db1a4f16::operator()
                       (&cmp,local_140._M_head_impl,
                        local_168.super__Head_base<0UL,_unsigned_int,_false>._M_head_impl);
    IntegerConstantType::~IntegerConstantType(&min);
  } while (tVar11 != GREATER);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_168);
  goto LAB_0047544e;
}

Assistant:

QKbo::Result QKbo::compare(Literal* l1, Literal* l2) const 
{
  if (l1 == l2) 
    return Result::EQUAL;

  auto i1 = AlascaState::interpretedPred(l1);
  auto i2 = AlascaState::interpretedPred(l2);
       if ( i1 && !i2) return Result::LESS;
  else if (!i1 &&  i2) return Result::GREATER;
  else if (!i1 && !i2) return TIME_TRACE_EXPR("uninterpreted", OU::lexProductCapture(
        [&]() { return _kbo.comparePredicatePrecedences(l1->functor(), l2->functor()); }
      , [&]() { return OU::lexExt(termArgIter(l1), termArgIter(l2), this->asClosure()); }
      , [&]() { return OU::stdCompare(l1->isNegative(), l2->isNegative()); }
    ));
  else {
    ASS(i1 && i2)
   
    auto a1_ = atomsWithLvl(l1);
    auto a2_ = atomsWithLvl(l2);
    if (!a1_.isSome() || !a2_.isSome())
      return Result::INCOMPARABLE;
    auto& a1 = a1_.unwrap();
    auto& a2 = a2_.unwrap();
    return OU::lexProductCapture(
        [&]() -> Ordering::Result { 
        TIME_TRACE("atoms with levels")
        return OU::weightedMulExt(*std::get<0>(a1), *std::get<0>(a2), 
                          [&](auto const& l, auto const& r)
                          { return OU::lexProductCapture(
                              [&]() { return this->compare(l.term, r.term); }
                            , [&]() { return OU::stdCompare(std::get<1>(a1),std::get<1>(a2)); }
                          );}); }
      , [&]() {
        // the atoms of the two literals are the same. 
        // This means they must be of the same sort
        auto sort =  SortHelper::getTermArgSort(l1,0);
        ASS_EQ(sort, SortHelper::getTermArgSort(l2,0));
        ASS_EQ(l1->isEquality() && l1->isPositive(), l2->isEquality() && l2->isPositive())
        return tryNumTraits([&](auto numTraits) {
          using NumTraits = decltype(numTraits);
          if (NumTraits::sort() != sort) {
            return Option<Ordering::Result>();
          } else {
            if (l1->isEquality() && l2->isEquality()) {
              TIME_TRACE("compare equalities")
              ASS_EQ(l1->isPositive(), l2->isPositive())
              return Option<Ordering::Result>(OU::lexProductCapture(
                  // TODO make use of the constant size of the multiset
                  [&]() { 
                    auto e1 = nfEquality<NumTraits>(l1);
                    auto e2 = nfEquality<NumTraits>(l2);
                    return OU::mulExt(*e1, *e2, this->asClosure()); }
                , [&]() { 
                  Recycled<MultiSet<TermList>> m1; m1->init(l1->termArg(0), l1->termArg(1));
                  Recycled<MultiSet<TermList>> m2; m2->init(l2->termArg(0), l2->termArg(1));
                  // TODO make use of the constant size of the multiset
                  return OU::mulExt(*m1,*m2,this->asClosure()); }
              ));
            } else if ( l1->isEquality() && !l2->isEquality()) {
              ASS(l1->isNegative())
              return Option<Ordering::Result>(Result::LESS);
            } else if (!l1->isEquality() &&  l2->isEquality()) {
              ASS(l2->isNegative())
              return Option<Ordering::Result>(Result::GREATER);
            } else if (l1->functor() == NumTraits::isIntF()) {
              ASS_EQ(l2->functor(), NumTraits::isIntF())
              ASS_EQ(l2->isPositive(), l1->isPositive())
              return some(this->compare(l1->termArg(0), l2->termArg(0)));
            } else {
              TIME_TRACE("compare inequqlities")
              ASS(l1->functor() == numTraits.greaterF() || l1->functor() == numTraits.geqF())
              ASS(l2->functor() == numTraits.greaterF() || l2->functor() == numTraits.geqF())
              ASS(l1->isPositive())
              ASS(l2->isPositive())
              return Option<Ordering::Result>(OU::lexProductCapture(
                  [&]() { return this->compare(l1->termArg(0), l2->termArg(0)); }
                , [&]() { return _kbo.comparePredicatePrecedences(l1->functor(), l2->functor()); }
              ));
            } 
          } 
        }) || [&]() {
          ASS_EQ(l1->isPositive(), l2->isPositive())
          // uninterpreted sort
          return Result::EQUAL;
        };
      }
    );
  }
}